

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O2

BailOutInstrTemplate<IR::Instr> *
IR::BailOutInstrTemplate<IR::Instr>::New
          (OpCode opcode,Opnd *dst,Opnd *src1,Opnd *src2,BailOutKind kind,Instr *bailOutTarget,
          Func *func)

{
  BailOutInstrTemplate<IR::Instr> *this;
  
  this = New(opcode,dst,src1,kind,bailOutTarget,func);
  Instr::SetSrc2(&this->super_Instr,src2);
  return this;
}

Assistant:

BailOutInstrTemplate<InstrType> *
BailOutInstrTemplate<InstrType>::New(Js::OpCode opcode, IR::Opnd *dst, IR::Opnd *src1, IR::Opnd *src2, BailOutKind kind, IR::Instr * bailOutTarget, Func * func)
{
    BailOutInstrTemplate *instr = BailOutInstrTemplate::New(opcode, dst, src1, kind, bailOutTarget, func);
    instr->SetSrc2(src2);

    return instr;
}